

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall
QPDFParser::addScalar<QPDF_Real,std::__cxx11::string_const&>
          (QPDFParser *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  QPDF *qpdf_p;
  size_type sVar1;
  size_type sVar2;
  element_type *this_00;
  qpdf_offset_t offset;
  undefined1 local_28 [8];
  shared_ptr<QPDFObject> obj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  QPDFParser *this_local;
  
  obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args;
  if (this->bad_count == 0) {
LAB_002fbd39:
    QPDFObject::create<QPDF_Real,std::__cxx11::string_const&>
              ((QPDFObject *)local_28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    qpdf_p = this->context;
    offset = InputSource::getLastOffset(this->input);
    QPDFObject::setDescription(this_00,qpdf_p,&this->description,offset);
    add(this,(shared_ptr<QPDFObject> *)local_28);
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_28);
  }
  else {
    sVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      (&this->frame->olist);
    if (sVar1 < 0x1389) {
      sVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::size(&this->frame->dict);
      if (sVar2 < 0x1389) goto LAB_002fbd39;
    }
    this->max_bad_count = 0;
  }
  return;
}

Assistant:

void
QPDFParser::addScalar(Args&&... args)
{
    if (bad_count && (frame->olist.size() > 5'000 || frame->dict.size() > 5'000)) {
        // Stop adding scalars. We are going to abort when the close token or a bad token is
        // encountered.
        max_bad_count = 0;
        return;
    }
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, input.getLastOffset());
    add(std::move(obj));
}